

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_old_swift_struct_writer
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pptVar6;
  string *psVar7;
  t_type *type;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  byte local_a9;
  t_field *ptStack_a8;
  bool optional;
  t_field *tfield;
  t_field **local_98;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  allocator local_49;
  string local_48 [8];
  string visibility;
  bool is_private_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  pcVar4 = "public";
  if (is_private) {
    pcVar4 = "private";
  }
  visibility.field_2._M_local_buf[0xf] = is_private;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar4,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,local_48);
  poVar5 = std::operator<<(poVar5," static func writeValue(__value: ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar5,", toProtocol __proto: TProtocol) throws");
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var_00,iVar2));
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_90);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"try __proto.writeStructBeginWithName(\"");
  poVar5 = std::operator<<(poVar5,(string *)&fields);
  poVar5 = std::operator<<(poVar5,"\")");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  local_98 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_90._M_current = local_98;
  while( true ) {
    tfield = (t_field *)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                       ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_90,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&tfield);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_90);
    ptStack_a8 = *pptVar6;
    local_a9 = field_is_optional(this,ptStack_a8);
    if ((bool)local_a9) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      poVar5 = std::operator<<(poVar5,"if let ");
      psVar7 = t_field::get_name_abi_cxx11_(ptStack_a8);
      maybe_escape_identifier(&local_d0,this,psVar7);
      poVar5 = std::operator<<(poVar5,(string *)&local_d0);
      poVar5 = std::operator<<(poVar5," = __value.");
      psVar7 = t_field::get_name_abi_cxx11_(ptStack_a8);
      maybe_escape_identifier(&local_f0,this,psVar7);
      std::operator<<(poVar5,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      block_open(this,out);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"try __proto.writeFieldValue(");
    pcVar4 = "__value.";
    if ((local_a9 & 1) != 0) {
      pcVar4 = "";
    }
    poVar5 = std::operator<<(poVar5,pcVar4);
    psVar7 = t_field::get_name_abi_cxx11_(ptStack_a8);
    maybe_escape_identifier(&local_110,this,psVar7);
    poVar5 = std::operator<<(poVar5,(string *)&local_110);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,"name: \"");
    psVar7 = t_field::get_name_abi_cxx11_(ptStack_a8);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,"\", ");
    poVar5 = std::operator<<(poVar5,"type: ");
    type = t_field::get_type(ptStack_a8);
    type_to_enum_abi_cxx11_(&local_130,this,type,false);
    poVar5 = std::operator<<(poVar5,(string *)&local_130);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,"id: ");
    iVar3 = t_field::get_key(ptStack_a8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    poVar5 = std::operator<<(poVar5,")");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    if ((local_a9 & 1) != 0) {
      block_close(this,out,true);
    }
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_90);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"try __proto.writeFieldStop()");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"try __proto.writeStructEnd()");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct_writer(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_private) {

  string visibility = is_private ? "private" : "public";

  indent(out) << visibility << " static func writeValue(__value: " << tstruct->get_name()
              << ", toProtocol __proto: TProtocol) throws";
  block_open(out);
  out << endl;

  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "try __proto.writeStructBeginWithName(\"" << name << "\")" << endl;
  out << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field *tfield = *f_iter;

    bool optional = field_is_optional(tfield);
    if (optional) {
      indent(out) << "if let " << maybe_escape_identifier(tfield->get_name())
                  << " = __value." << maybe_escape_identifier(tfield->get_name());
      block_open(out);
    }

    indent(out) << "try __proto.writeFieldValue("
                << (optional ? "" : "__value.") << maybe_escape_identifier(tfield->get_name()) << ", "
                << "name: \"" << tfield->get_name() << "\", "
                << "type: " << type_to_enum(tfield->get_type()) << ", "
                << "id: " << tfield->get_key() << ")" << endl;

    if (optional) {
      block_close(out);
    }

    out << endl;
  }

  indent(out) << "try __proto.writeFieldStop()" << endl << endl;
  indent(out) << "try __proto.writeStructEnd()" << endl;
  block_close(out);
  out << endl;
}